

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

fio_url_s * fio_url_parse(fio_url_s *__return_storage_ptr__,char *url,size_t length)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  size_t sVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  bool bVar12;
  
  memset(__return_storage_ptr__,0,0xc0);
  (__return_storage_ptr__->scheme).data = url;
  if (length == 0) goto LAB_0010bb6c;
  pbVar1 = (byte *)(url + length);
  if (*url == '/') {
LAB_0010b713:
    bVar12 = url < pbVar1;
    pbVar5 = (byte *)url;
    if (bVar12) {
      sVar6 = 0;
      do {
        if ((*pbVar5 == 0x23) || (*pbVar5 == 0x3f)) {
          (__return_storage_ptr__->path).capa = 0;
          (__return_storage_ptr__->path).len = sVar6;
          (__return_storage_ptr__->path).data = url;
          if (!bVar12) goto LAB_0010bb6c;
          pbVar8 = pbVar5 + 1;
          pbVar4 = pbVar8;
          if (*pbVar5 == 0x23) goto LAB_0010b9b2;
          goto joined_r0x0010b958;
        }
        pbVar5 = pbVar5 + 1;
        sVar6 = sVar6 + 1;
        bVar12 = pbVar5 < pbVar1;
      } while (bVar12);
    }
    (__return_storage_ptr__->path).capa = 0;
    (__return_storage_ptr__->path).len = (long)pbVar5 - (long)url;
    (__return_storage_ptr__->path).data = url;
    goto LAB_0010bb6c;
  }
  pbVar8 = (byte *)url;
  if (0 < (long)length) {
    do {
      if ((*pbVar8 - 0x23 < 0x1e) && ((0x30801001U >> (*pbVar8 - 0x23 & 0x1f) & 1) != 0)) break;
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 < pbVar1);
  }
  if (pbVar8 == pbVar1) {
    (__return_storage_ptr__->host).capa = 0;
    (__return_storage_ptr__->host).len = (long)pbVar8 - (long)url;
    (__return_storage_ptr__->host).data = url;
    goto LAB_0010bb6c;
  }
  bVar2 = *pbVar8;
  lVar7 = 0x28;
  lVar9 = 0x20;
  lVar10 = 0x18;
  if (bVar2 < 0x3a) {
    if (bVar2 == 0x23) {
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)pbVar8 - (long)url;
      (__return_storage_ptr__->host).data = url;
LAB_0010b9ac:
      pbVar8 = pbVar8 + 1;
LAB_0010b9b2:
      (__return_storage_ptr__->target).capa = 0;
      (__return_storage_ptr__->target).len = (long)pbVar1 - (long)pbVar8;
      (__return_storage_ptr__->target).data = (char *)pbVar8;
      goto LAB_0010bb6c;
    }
    if (bVar2 == 0x2f) {
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)pbVar8 - (long)url;
      (__return_storage_ptr__->host).data = url;
      url = (char *)pbVar8;
      goto LAB_0010b713;
    }
  }
  else if (bVar2 == 0x3a) {
    pbVar4 = pbVar8;
    pbVar5 = (byte *)url;
    if (((pbVar1 < pbVar8 + 2) || (pbVar8[1] != 0x2f)) || (pbVar8[2] != 0x2f)) {
LAB_0010b9d6:
      (__return_storage_ptr__->user).capa = 0;
      (__return_storage_ptr__->user).len = (long)pbVar4 - (long)pbVar5;
      (__return_storage_ptr__->user).data = (char *)pbVar5;
      pbVar8 = pbVar4 + 1;
LAB_0010b9ef:
      bVar12 = pbVar8 < pbVar1;
      url = (char *)pbVar8;
      if (bVar12) {
        sVar6 = 0;
        do {
          if ((pbVar8[sVar6] == 0x2f) || (pbVar8[sVar6] == 0x40)) {
            url = (char *)(pbVar8 + sVar6);
            if (!bVar12) goto LAB_0010bb47;
            if (*url == 0x2f) {
              (__return_storage_ptr__->port).capa = 0;
              (__return_storage_ptr__->port).len = sVar6;
              (__return_storage_ptr__->port).data = (char *)pbVar8;
              sVar6 = (__return_storage_ptr__->user).len;
              (__return_storage_ptr__->host).capa = (__return_storage_ptr__->user).capa;
              (__return_storage_ptr__->host).len = sVar6;
              (__return_storage_ptr__->host).data = (__return_storage_ptr__->user).data;
              (__return_storage_ptr__->user).len = 0;
              goto LAB_0010b713;
            }
            pbVar4 = (byte *)url;
            if (*url != 0x40) goto LAB_0010b7f0;
            lVar7 = 0x40;
            lVar9 = 0x38;
            lVar10 = 0x30;
            pbVar4 = pbVar8;
            pbVar8 = (byte *)url;
            goto LAB_0010b7d7;
          }
          lVar7 = sVar6 + 1;
          sVar6 = sVar6 + 1;
          bVar12 = pbVar8 + lVar7 < pbVar1;
        } while (bVar12);
        url = (char *)(pbVar8 + sVar6);
      }
LAB_0010bb47:
      (__return_storage_ptr__->port).capa = 0;
      (__return_storage_ptr__->port).len = (long)url - (long)pbVar8;
      (__return_storage_ptr__->port).data = (char *)pbVar8;
      sVar6 = (__return_storage_ptr__->user).len;
      (__return_storage_ptr__->host).capa = (__return_storage_ptr__->user).capa;
      (__return_storage_ptr__->host).len = sVar6;
      (__return_storage_ptr__->host).data = (__return_storage_ptr__->user).data;
      (__return_storage_ptr__->user).len = 0;
      goto LAB_0010bb6c;
    }
    (__return_storage_ptr__->scheme).len = (long)pbVar8 - (long)url;
    pbVar8 = pbVar8 + 3;
  }
  else {
    if (bVar2 == 0x3f) {
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)pbVar8 - (long)url;
      (__return_storage_ptr__->host).data = url;
LAB_0010b94f:
      pbVar8 = pbVar8 + 1;
      pbVar4 = pbVar8;
joined_r0x0010b958:
      for (; (pbVar8 < pbVar1 && (*pbVar8 != 0x23)); pbVar8 = pbVar8 + 1) {
      }
      (__return_storage_ptr__->query).capa = 0;
      (__return_storage_ptr__->query).len = (long)pbVar8 - (long)pbVar4;
      (__return_storage_ptr__->query).data = (char *)pbVar4;
      pbVar8 = pbVar8 + 1;
      if (pbVar1 <= pbVar8) goto LAB_0010bb6c;
      goto LAB_0010b9b2;
    }
    pbVar4 = (byte *)url;
    if (bVar2 == 0x40) {
LAB_0010b7d7:
      *(undefined8 *)((long)&(__return_storage_ptr__->scheme).capa + lVar10) = 0;
      *(long *)((long)&(__return_storage_ptr__->scheme).capa + lVar9) = (long)pbVar8 - (long)pbVar4;
      *(byte **)((long)&(__return_storage_ptr__->scheme).capa + lVar7) = pbVar4;
      pbVar4 = pbVar8 + 1;
LAB_0010b7f0:
      bVar12 = pbVar4 < pbVar1;
      pbVar8 = pbVar4;
      if (bVar12) {
        sVar6 = 0;
        do {
          if (((ulong)*pbVar8 < 0x40) && ((0x8400800800000000U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)
             ) {
            (__return_storage_ptr__->host).capa = 0;
            (__return_storage_ptr__->host).len = sVar6;
            (__return_storage_ptr__->host).data = (char *)pbVar4;
            if (!bVar12) goto LAB_0010bb6c;
            bVar2 = *pbVar8;
            if (bVar2 == 0x23) goto LAB_0010b9ac;
            if (bVar2 == 0x3f) goto LAB_0010b94f;
            url = (char *)pbVar8;
            if (bVar2 == 0x2f) goto LAB_0010b713;
            pbVar8 = pbVar8 + 1;
            bVar12 = pbVar8 < pbVar1;
            url = (char *)pbVar8;
            if (!bVar12) goto LAB_0010baaf;
            sVar11 = 0;
            goto LAB_0010ba8c;
          }
          pbVar8 = pbVar8 + 1;
          sVar6 = sVar6 + 1;
          bVar12 = pbVar8 < pbVar1;
        } while (bVar12);
      }
      (__return_storage_ptr__->host).capa = 0;
      (__return_storage_ptr__->host).len = (long)pbVar8 - (long)pbVar4;
      (__return_storage_ptr__->host).data = (char *)pbVar4;
      goto LAB_0010bb6c;
    }
  }
  bVar12 = pbVar8 < pbVar1;
  url = (char *)pbVar8;
  if (bVar12) {
    sVar6 = 0;
    do {
      if ((pbVar8[sVar6] - 0x2f < 0x12) && ((0x20801U >> (pbVar8[sVar6] - 0x2f & 0x1f) & 1) != 0)) {
        url = (char *)(pbVar8 + sVar6);
        if (!bVar12) goto LAB_0010bafe;
        bVar2 = *url;
        if (bVar2 == 0x2f) {
          (__return_storage_ptr__->host).capa = 0;
          (__return_storage_ptr__->host).len = sVar6;
          (__return_storage_ptr__->host).data = (char *)pbVar8;
          goto LAB_0010b713;
        }
        pbVar4 = (byte *)url;
        pbVar5 = pbVar8;
        if (bVar2 == 0x3a) goto LAB_0010b9d6;
        pbVar4 = pbVar8;
        pbVar8 = (byte *)url;
        if (bVar2 != 0x40) goto LAB_0010b9ef;
        goto LAB_0010b7d7;
      }
      lVar3 = sVar6 + 1;
      sVar6 = sVar6 + 1;
      bVar12 = pbVar8 + lVar3 < pbVar1;
    } while (bVar12);
    url = (char *)(pbVar8 + sVar6);
  }
LAB_0010bafe:
  (__return_storage_ptr__->host).capa = 0;
  (__return_storage_ptr__->host).len = (long)url - (long)pbVar8;
  (__return_storage_ptr__->host).data = (char *)pbVar8;
LAB_0010bb6c:
  if ((__return_storage_ptr__->scheme).len == 0) {
    (__return_storage_ptr__->scheme).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->user).len == 0) {
    (__return_storage_ptr__->user).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->password).len == 0) {
    (__return_storage_ptr__->password).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->host).len == 0) {
    (__return_storage_ptr__->host).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->port).len == 0) {
    (__return_storage_ptr__->port).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->path).len == 0) {
    (__return_storage_ptr__->path).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->query).len == 0) {
    (__return_storage_ptr__->query).data = (char *)0x0;
  }
  if ((__return_storage_ptr__->target).len == 0) {
    (__return_storage_ptr__->target).data = (char *)0x0;
  }
  return __return_storage_ptr__;
  while( true ) {
    url = (char *)((byte *)url + 1);
    sVar11 = sVar11 + 1;
    bVar12 = url < pbVar1;
    if (!bVar12) break;
LAB_0010ba8c:
    if (((ulong)(byte)*url < 0x40) && ((0x8000800800000000U >> ((ulong)(byte)*url & 0x3f) & 1) != 0)
       ) {
      (__return_storage_ptr__->port).capa = 0;
      (__return_storage_ptr__->port).len = sVar11;
      (__return_storage_ptr__->port).data = (char *)pbVar8;
      if (!bVar12) goto LAB_0010bb6c;
      if (*url == 0x23) {
        pbVar8 = (byte *)url + 1;
        goto LAB_0010b9b2;
      }
      if (*url != 0x3f) goto LAB_0010b713;
      pbVar8 = (byte *)url + 1;
      pbVar4 = pbVar8;
      goto joined_r0x0010b958;
    }
  }
LAB_0010baaf:
  (__return_storage_ptr__->port).capa = 0;
  (__return_storage_ptr__->port).len = (size_t)((byte *)url + (~(ulong)pbVar4 - sVar6));
  (__return_storage_ptr__->port).data = (char *)pbVar8;
  goto LAB_0010bb6c;
}

Assistant:

fio_url_s fio_url_parse(const char *url, size_t length) {
  /*
  Intention:
  [schema://][user[:]][password[@]][host.com[:/]][:port/][/path][?quary][#target]
  */
  const char *end = url + length;
  const char *pos = url;
  fio_url_s r = {.scheme = {.data = (char *)url}};
  if (length == 0) {
    goto finish;
  }

  if (pos[0] == '/') {
    /* start at path */
    goto start_path;
  }

  while (pos < end && pos[0] != ':' && pos[0] != '/' && pos[0] != '@' &&
         pos[0] != '#' && pos[0] != '?')
    ++pos;

  if (pos == end) {
    /* was only host (path starts with '/') */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto finish;
  }
  switch (pos[0]) {
  case '@':
    /* username@[host] */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_host;
  case '/':
    /* host[/path] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto start_path;
  case '?':
    /* host?[query] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_query;
  case '#':
    /* host#[target] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_target;
  case ':':
    if (pos + 2 <= end && pos[1] == '/' && pos[2] == '/') {
      /* scheme:// */
      r.scheme.len = pos - url;
      pos += 3;
    } else {
      /* username:[password] OR */
      /* host:[port] */
      r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
      ++pos;
      goto start_password;
    }
    break;
  }

  // start_username:
  url = pos;
  while (pos < end && pos[0] != ':' && pos[0] != '/' && pos[0] != '@'
         /* && pos[0] != '#' && pos[0] != '?' */)
    ++pos;

  if (pos >= end) { /* scheme://host */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto finish;
  }

  switch (pos[0]) {
  case '/':
    /* scheme://host[/path] */
    r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    goto start_path;
  case '@':
    /* scheme://username@[host]... */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    goto start_host;
  case ':':
    /* scheme://username:[password]@[host]... OR */
    /* scheme://host:[port][/...] */
    r.user = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    break;
  }

start_password:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != '@')
    ++pos;

  if (pos >= end) {
    /* was host:port */
    r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    r.host = r.user;
    r.user.len = 0;
    goto finish;
    ;
  }

  switch (pos[0]) {
  case '/':
    r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    r.host = r.user;
    r.user.len = 0;
    goto start_path;
  case '@':
    r.password = (fio_str_info_s){.data = (char *)url, .len = pos - url};
    ++pos;
    break;
  }

start_host:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != ':' && pos[0] != '#' &&
         pos[0] != '?')
    ++pos;

  r.host = (fio_str_info_s){.data = (char *)url, .len = pos - url};
  if (pos >= end) {
    goto finish;
  }
  switch (pos[0]) {
  case '/':
    /* scheme://[...@]host[/path] */
    goto start_path;
  case '?':
    /* scheme://[...@]host?[query] (bad)*/
    ++pos;
    goto start_query;
  case '#':
    /* scheme://[...@]host#[target] (bad)*/
    ++pos;
    goto start_target;
    // case ':':
    /* scheme://[...@]host:[port] */
  }
  ++pos;

  // start_port:
  url = pos;
  while (pos < end && pos[0] != '/' && pos[0] != '#' && pos[0] != '?')
    ++pos;

  r.port = (fio_str_info_s){.data = (char *)url, .len = pos - url};

  if (pos >= end) {
    /* scheme://[...@]host:port */
    goto finish;
  }
  switch (pos[0]) {
  case '?':
    /* scheme://[...@]host:port?[query] (bad)*/
    ++pos;
    goto start_query;
  case '#':
    /* scheme://[...@]host:port#[target] (bad)*/
    ++pos;
    goto start_target;
    // case '/':
    /* scheme://[...@]host:port[/path] */
  }

start_path:
  url = pos;
  while (pos < end && pos[0] != '#' && pos[0] != '?')
    ++pos;

  r.path = (fio_str_info_s){.data = (char *)url, .len = pos - url};

  if (pos >= end) {
    goto finish;
  }
  ++pos;
  if (pos[-1] == '#')
    goto start_target;

start_query:
  url = pos;
  while (pos < end && pos[0] != '#')
    ++pos;

  r.query = (fio_str_info_s){.data = (char *)url, .len = pos - url};
  ++pos;

  if (pos >= end)
    goto finish;

start_target:
  r.target = (fio_str_info_s){.data = (char *)pos, .len = end - pos};

finish:

  /* set any empty values to NULL */
  if (!r.scheme.len)
    r.scheme.data = NULL;
  if (!r.user.len)
    r.user.data = NULL;
  if (!r.password.len)
    r.password.data = NULL;
  if (!r.host.len)
    r.host.data = NULL;
  if (!r.port.len)
    r.port.data = NULL;
  if (!r.path.len)
    r.path.data = NULL;
  if (!r.query.len)
    r.query.data = NULL;
  if (!r.target.len)
    r.target.data = NULL;

  return r;
}